

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutual_info.c
# Opt level: O0

double inform_mutual_info(int *series,size_t l,size_t n,int *b,inform_error *err)

{
  _Bool _Var1;
  int *piVar2;
  double mi;
  inform_dist *joint;
  inform_dist **marginals;
  inform_error *err_local;
  int *b_local;
  size_t n_local;
  size_t l_local;
  int *series_local;
  
  marginals = (inform_dist **)err;
  err_local = b;
  b_local = (int *)n;
  n_local = l;
  l_local = (size_t)series;
  _Var1 = check_arguments(series,l,n,b,err);
  if (_Var1) {
    series_local = (int *)0x7ff8000000000000;
  }
  else {
    joint = (inform_dist *)malloc(n_local << 3);
    if (joint == (inform_dist *)0x0) {
      if (marginals != (inform_dist **)0x0) {
        *(undefined4 *)marginals = 3;
      }
      series_local = (int *)0x7ff8000000000000;
    }
    else {
      mi = 0.0;
      _Var1 = allocate(err_local,n_local,(inform_dist **)&mi,(inform_dist **)joint,
                       (inform_error *)marginals);
      if (_Var1) {
        free(joint);
        series_local = (int *)0x7ff8000000000000;
      }
      else {
        accumulate((int *)l_local,n_local,(size_t)b_local,err_local,(inform_dist *)mi,
                   (inform_dist **)joint);
        piVar2 = (int *)inform_shannon_multi_mi((inform_dist *)mi,(inform_dist **)joint,n_local,2.0)
        ;
        free_all((inform_dist **)&mi,(inform_dist **)joint,n_local);
        series_local = piVar2;
      }
    }
  }
  return (double)series_local;
}

Assistant:

double inform_mutual_info(int const *series, size_t l, size_t n, int const *b,
    inform_error *err)
{
    if (check_arguments(series, l, n, b, err)) return NAN;

    inform_dist **marginals = malloc(l * sizeof(inform_dist*));
    if (marginals == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }
    inform_dist *joint = NULL;
    if (allocate(b, l, &joint, marginals, err))
    {
        free(marginals);
        return NAN;
    }

    accumulate(series, l, n, b, joint, marginals);

    double mi = inform_shannon_multi_mi(joint, (inform_dist const **)marginals, l, 2.0);

    free_all(&joint, marginals, l);

    return mi;
}